

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

bool __thiscall Parsing::File::rm(File *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = access((this->_path)._M_dataplus._M_p,0);
  bVar2 = false;
  if ((iVar1 != -1) && (bVar2 = false, (this->_path)._M_string_length != 0)) {
    iVar1 = remove((this->_path)._M_dataplus._M_p);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool File::rm() const noexcept
    {
        if (!isFile() || _path.empty())
            return false;
        if (remove(_path.c_str()) != 0)
            return false;
        return true;
    }